

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::removeCommand(Server *this,string_view trigger)

{
  bool bVar1;
  reference this_00;
  pointer pGVar2;
  ulong uVar3;
  const_iterator local_50;
  size_t local_48;
  char *local_40;
  __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
  local_38;
  __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
  local_30;
  iterator itr;
  Server *this_local;
  string_view trigger_local;
  
  itr._M_current = (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)this;
  local_30._M_current =
       (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)
       std::
       vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
       ::begin(&this->m_commands);
  while( true ) {
    local_38._M_current =
         (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)
         std::
         vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
         ::end(&this->m_commands);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
                      (&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
              ::operator*(&local_30);
    pGVar2 = std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>::operator->
                       (this_00);
    local_48 = trigger._M_len;
    local_40 = trigger._M_str;
    uVar3 = Jupiter::Command::matches(pGVar2,trigger._M_len,trigger._M_str);
    if ((uVar3 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
    ::operator++(&local_30);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>const*,std::vector<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>,std::allocator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>>>>
  ::__normal_iterator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>*>
            ((__normal_iterator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>const*,std::vector<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>,std::allocator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>>>>
              *)&local_50,&local_30);
  std::
  vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ::erase(&this->m_commands,local_50);
  return true;
}

Assistant:

bool RenX::Server::removeCommand(std::string_view trigger) {
	for (auto itr = m_commands.begin(); itr != m_commands.end(); ++itr) {
		if ((*itr)->matches(trigger)) {
			m_commands.erase(itr);
			return true;
		}
	}

	return false;
}